

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  byte bVar35;
  byte bVar36;
  int iVar37;
  float *vertices;
  undefined1 (*pauVar38) [32];
  ulong uVar39;
  long lVar40;
  byte bVar41;
  uint uVar42;
  undefined4 uVar43;
  ulong uVar44;
  NodeRef root;
  byte bVar45;
  ulong *puVar46;
  bool bVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar88 [64];
  Precalculations pre;
  vuint<4> *v;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d51;
  RayQueryContext *local_5d50;
  size_t local_5d48;
  undefined4 local_5d3c;
  RayK<8> *local_5d38;
  BVH *local_5d30;
  Intersectors *local_5d28;
  ulong local_5d20;
  ulong local_5d18;
  Scene *local_5d10;
  long local_5d08;
  undefined1 local_5d00 [32];
  RTCFilterFunctionNArguments local_5cd0;
  undefined1 local_5ca0 [32];
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 local_5c70;
  undefined8 uStack_5c68;
  int local_5c60;
  int iStack_5c5c;
  int iStack_5c58;
  int iStack_5c54;
  int iStack_5c50;
  int iStack_5c4c;
  int iStack_5c48;
  int iStack_5c44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c40;
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  undefined4 uStack_5b04;
  float local_5b00;
  float fStack_5afc;
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined4 uStack_5ae4;
  undefined1 local_5ae0 [32];
  int local_5ac0;
  int iStack_5abc;
  int iStack_5ab8;
  int iStack_5ab4;
  int iStack_5ab0;
  int iStack_5aac;
  int iStack_5aa8;
  int iStack_5aa4;
  uint local_5aa0;
  uint uStack_5a9c;
  uint uStack_5a98;
  uint uStack_5a94;
  uint uStack_5a90;
  uint uStack_5a8c;
  uint uStack_5a88;
  uint uStack_5a84;
  uint local_5a80;
  uint uStack_5a7c;
  uint uStack_5a78;
  uint uStack_5a74;
  uint uStack_5a70;
  uint uStack_5a6c;
  uint uStack_5a68;
  uint uStack_5a64;
  uint local_5a60;
  uint uStack_5a5c;
  uint uStack_5a58;
  uint uStack_5a54;
  uint uStack_5a50;
  uint uStack_5a4c;
  uint uStack_5a48;
  uint uStack_5a44;
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [8];
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined1 local_5960 [8];
  float fStack_5958;
  float fStack_5954;
  float fStack_5950;
  float fStack_594c;
  float fStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  undefined4 uStack_58a4;
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  
  local_5d30 = (BVH *)This->ptr;
  local_5808 = (local_5d30->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar52 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar49 = ZEXT816(0) << 0x40;
      uVar48 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar49),5);
      uVar44 = vpcmpeqd_avx512vl(auVar52,(undefined1  [32])valid_i->field_0);
      uVar48 = uVar48 & uVar44;
      bVar41 = (byte)uVar48;
      if (bVar41 != 0) {
        local_5c40._0_4_ = *(float *)ray;
        local_5c40._4_4_ = *(float *)(ray + 4);
        local_5c40._8_4_ = *(float *)(ray + 8);
        local_5c40._12_4_ = *(float *)(ray + 0xc);
        local_5c40._16_4_ = *(float *)(ray + 0x10);
        local_5c40._20_4_ = *(float *)(ray + 0x14);
        local_5c40._24_4_ = *(float *)(ray + 0x18);
        local_5c40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5c40._32_4_ = *(float *)(ray + 0x20);
        local_5c40._36_4_ = *(float *)(ray + 0x24);
        local_5c40._40_4_ = *(float *)(ray + 0x28);
        local_5c40._44_4_ = *(float *)(ray + 0x2c);
        local_5c40._48_4_ = *(float *)(ray + 0x30);
        local_5c40._52_4_ = *(float *)(ray + 0x34);
        local_5c40._56_4_ = *(float *)(ray + 0x38);
        local_5c40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5c40._64_4_ = *(float *)(ray + 0x40);
        local_5c40._68_4_ = *(float *)(ray + 0x44);
        local_5c40._72_4_ = *(float *)(ray + 0x48);
        local_5c40._76_4_ = *(float *)(ray + 0x4c);
        local_5c40._80_4_ = *(float *)(ray + 0x50);
        local_5c40._84_4_ = *(float *)(ray + 0x54);
        local_5c40._88_4_ = *(float *)(ray + 0x58);
        local_5c40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_5be0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5bc0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5ba0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar54._8_4_ = 0x7fffffff;
        auVar54._0_8_ = 0x7fffffff7fffffff;
        auVar54._12_4_ = 0x7fffffff;
        auVar54._16_4_ = 0x7fffffff;
        auVar54._20_4_ = 0x7fffffff;
        auVar54._24_4_ = 0x7fffffff;
        auVar54._28_4_ = 0x7fffffff;
        auVar52 = vandps_avx(auVar54,local_5be0);
        auVar50._8_4_ = 0x219392ef;
        auVar50._0_8_ = 0x219392ef219392ef;
        auVar50._12_4_ = 0x219392ef;
        auVar50._16_4_ = 0x219392ef;
        auVar50._20_4_ = 0x219392ef;
        auVar50._24_4_ = 0x219392ef;
        auVar50._28_4_ = 0x219392ef;
        uVar44 = vcmpps_avx512vl(auVar52,auVar50,1);
        bVar47 = (bool)((byte)uVar44 & 1);
        auVar51._0_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5be0._0_4_;
        bVar47 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5be0._4_4_;
        bVar47 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5be0._8_4_;
        bVar47 = (bool)((byte)(uVar44 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5be0._12_4_;
        bVar47 = (bool)((byte)(uVar44 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5be0._16_4_;
        bVar47 = (bool)((byte)(uVar44 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5be0._20_4_;
        bVar47 = (bool)((byte)(uVar44 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5be0._24_4_;
        bVar47 = SUB81(uVar44 >> 7,0);
        auVar51._28_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5be0._28_4_;
        auVar52 = vandps_avx(auVar54,local_5bc0);
        uVar44 = vcmpps_avx512vl(auVar52,auVar50,1);
        bVar47 = (bool)((byte)uVar44 & 1);
        auVar55._0_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5bc0._0_4_;
        bVar47 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5bc0._4_4_;
        bVar47 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5bc0._8_4_;
        bVar47 = (bool)((byte)(uVar44 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5bc0._12_4_;
        bVar47 = (bool)((byte)(uVar44 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5bc0._16_4_;
        bVar47 = (bool)((byte)(uVar44 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5bc0._20_4_;
        bVar47 = (bool)((byte)(uVar44 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5bc0._24_4_;
        bVar47 = SUB81(uVar44 >> 7,0);
        auVar55._28_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5bc0._28_4_;
        auVar52 = vandps_avx(auVar54,local_5ba0);
        uVar44 = vcmpps_avx512vl(auVar52,auVar50,1);
        bVar47 = (bool)((byte)uVar44 & 1);
        auVar52._0_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ba0._0_4_;
        bVar47 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ba0._4_4_;
        bVar47 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ba0._8_4_;
        bVar47 = (bool)((byte)(uVar44 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ba0._12_4_;
        bVar47 = (bool)((byte)(uVar44 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ba0._16_4_;
        bVar47 = (bool)((byte)(uVar44 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ba0._20_4_;
        bVar47 = (bool)((byte)(uVar44 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ba0._24_4_;
        bVar47 = SUB81(uVar44 >> 7,0);
        auVar52._28_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ba0._28_4_;
        auVar53._8_4_ = 0x3f800000;
        auVar53._0_8_ = 0x3f8000003f800000;
        auVar53._12_4_ = 0x3f800000;
        auVar53._16_4_ = 0x3f800000;
        auVar53._20_4_ = 0x3f800000;
        auVar53._24_4_ = 0x3f800000;
        auVar53._28_4_ = 0x3f800000;
        auVar50 = vrcp14ps_avx512vl(auVar51);
        auVar21 = vfnmadd213ps_fma(auVar51,auVar50,auVar53);
        auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar50,auVar50);
        auVar51 = vrcp14ps_avx512vl(auVar55);
        auVar22 = vfnmadd213ps_fma(auVar55,auVar51,auVar53);
        auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar51,auVar51);
        auVar51 = vrcp14ps_avx512vl(auVar52);
        auVar23 = vfnmadd213ps_fma(auVar52,auVar51,auVar53);
        local_5b80 = ZEXT1632(auVar21);
        local_5b60 = ZEXT1632(auVar22);
        auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar51,auVar51);
        local_5b40 = ZEXT1632(auVar23);
        local_5ae0._4_4_ = *(float *)(ray + 0x44) * auVar23._4_4_;
        local_5ae0._0_4_ = *(float *)(ray + 0x40) * auVar23._0_4_;
        local_5ae0._8_4_ = *(float *)(ray + 0x48) * auVar23._8_4_;
        local_5ae0._12_4_ = *(float *)(ray + 0x4c) * auVar23._12_4_;
        local_5ae0._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_5ae0._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_5ae0._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_5ae0._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_5b20 = *(float *)ray * auVar21._0_4_;
        fStack_5b1c = *(float *)(ray + 4) * auVar21._4_4_;
        fStack_5b18 = *(float *)(ray + 8) * auVar21._8_4_;
        fStack_5b14 = *(float *)(ray + 0xc) * auVar21._12_4_;
        fStack_5b10 = *(float *)(ray + 0x10) * 0.0;
        fStack_5b0c = *(float *)(ray + 0x14) * 0.0;
        fStack_5b08 = *(float *)(ray + 0x18) * 0.0;
        uStack_5b04 = *(undefined4 *)(ray + 0x1c);
        local_5b00 = *(float *)(ray + 0x20) * auVar22._0_4_;
        fStack_5afc = *(float *)(ray + 0x24) * auVar22._4_4_;
        fStack_5af8 = *(float *)(ray + 0x28) * auVar22._8_4_;
        fStack_5af4 = *(float *)(ray + 0x2c) * auVar22._12_4_;
        fStack_5af0 = *(float *)(ray + 0x30) * 0.0;
        fStack_5aec = *(float *)(ray + 0x34) * 0.0;
        fStack_5ae8 = *(float *)(ray + 0x38) * 0.0;
        uStack_5ae4 = *(undefined4 *)(ray + 0x3c);
        uVar44 = vcmpps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar49),1);
        auVar52 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5ac0 = (uint)((byte)uVar44 & 1) * auVar52._0_4_;
        iStack_5abc = (uint)((byte)(uVar44 >> 1) & 1) * auVar52._4_4_;
        iStack_5ab8 = (uint)((byte)(uVar44 >> 2) & 1) * auVar52._8_4_;
        iStack_5ab4 = (uint)((byte)(uVar44 >> 3) & 1) * auVar52._12_4_;
        iStack_5ab0 = (uint)((byte)(uVar44 >> 4) & 1) * auVar52._16_4_;
        iStack_5aac = (uint)((byte)(uVar44 >> 5) & 1) * auVar52._20_4_;
        iStack_5aa8 = (uint)((byte)(uVar44 >> 6) & 1) * auVar52._24_4_;
        iStack_5aa4 = (uint)(byte)(uVar44 >> 7) * auVar52._28_4_;
        auVar51 = ZEXT1632(auVar49);
        uVar44 = vcmpps_avx512vl(ZEXT1632(auVar22),auVar51,5);
        auVar52 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar47 = (bool)((byte)uVar44 & 1);
        bVar7 = (bool)((byte)(uVar44 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar44 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar44 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar44 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar44 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar44 >> 6) & 1);
        bVar13 = SUB81(uVar44 >> 7,0);
        local_5aa0 = (uint)bVar47 * auVar52._0_4_ | (uint)!bVar47 * 0x60;
        uStack_5a9c = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * 0x60;
        uStack_5a98 = (uint)bVar8 * auVar52._8_4_ | (uint)!bVar8 * 0x60;
        uStack_5a94 = (uint)bVar9 * auVar52._12_4_ | (uint)!bVar9 * 0x60;
        uStack_5a90 = (uint)bVar10 * auVar52._16_4_ | (uint)!bVar10 * 0x60;
        uStack_5a8c = (uint)bVar11 * auVar52._20_4_ | (uint)!bVar11 * 0x60;
        uStack_5a88 = (uint)bVar12 * auVar52._24_4_ | (uint)!bVar12 * 0x60;
        uStack_5a84 = (uint)bVar13 * auVar52._28_4_ | (uint)!bVar13 * 0x60;
        uVar44 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar51,5);
        auVar52 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar47 = (bool)((byte)uVar44 & 1);
        bVar7 = (bool)((byte)(uVar44 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar44 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar44 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar44 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar44 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar44 >> 6) & 1);
        bVar13 = SUB81(uVar44 >> 7,0);
        local_5a80 = (uint)bVar47 * auVar52._0_4_ | (uint)!bVar47 * 0xa0;
        uStack_5a7c = (uint)bVar7 * auVar52._4_4_ | (uint)!bVar7 * 0xa0;
        uStack_5a78 = (uint)bVar8 * auVar52._8_4_ | (uint)!bVar8 * 0xa0;
        uStack_5a74 = (uint)bVar9 * auVar52._12_4_ | (uint)!bVar9 * 0xa0;
        uStack_5a70 = (uint)bVar10 * auVar52._16_4_ | (uint)!bVar10 * 0xa0;
        uStack_5a6c = (uint)bVar11 * auVar52._20_4_ | (uint)!bVar11 * 0xa0;
        uStack_5a68 = (uint)bVar12 * auVar52._24_4_ | (uint)!bVar12 * 0xa0;
        uStack_5a64 = (uint)bVar13 * auVar52._28_4_ | (uint)!bVar13 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar86 = ZEXT3264(local_4680);
        auVar52 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar51);
        local_5a60 = (uint)(bVar41 & 1) * auVar52._0_4_ |
                     (uint)!(bool)(bVar41 & 1) * local_4680._0_4_;
        bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
        uStack_5a5c = (uint)bVar47 * auVar52._4_4_ | (uint)!bVar47 * local_4680._4_4_;
        bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
        uStack_5a58 = (uint)bVar47 * auVar52._8_4_ | (uint)!bVar47 * local_4680._8_4_;
        bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
        uStack_5a54 = (uint)bVar47 * auVar52._12_4_ | (uint)!bVar47 * local_4680._12_4_;
        bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
        uStack_5a50 = (uint)bVar47 * auVar52._16_4_ | (uint)!bVar47 * local_4680._16_4_;
        bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
        uStack_5a4c = (uint)bVar47 * auVar52._20_4_ | (uint)!bVar47 * local_4680._20_4_;
        bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
        uStack_5a48 = (uint)bVar47 * auVar52._24_4_ | (uint)!bVar47 * local_4680._24_4_;
        bVar47 = SUB81(uVar48 >> 7,0);
        uStack_5a44 = (uint)bVar47 * auVar52._28_4_ | (uint)!bVar47 * local_4680._28_4_;
        local_5d3c = (undefined4)uVar48;
        auVar52 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar51);
        local_5a40._0_4_ =
             (uint)(bVar41 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar41 & 1) * -0x800000;
        bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
        local_5a40._4_4_ = (uint)bVar47 * auVar52._4_4_ | (uint)!bVar47 * -0x800000;
        bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
        local_5a40._8_4_ = (uint)bVar47 * auVar52._8_4_ | (uint)!bVar47 * -0x800000;
        bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
        local_5a40._12_4_ = (uint)bVar47 * auVar52._12_4_ | (uint)!bVar47 * -0x800000;
        bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
        local_5a40._16_4_ = (uint)bVar47 * auVar52._16_4_ | (uint)!bVar47 * -0x800000;
        bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
        local_5a40._20_4_ = (uint)bVar47 * auVar52._20_4_ | (uint)!bVar47 * -0x800000;
        bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
        local_5a40._24_4_ = (uint)bVar47 * auVar52._24_4_ | (uint)!bVar47 * -0x800000;
        bVar47 = SUB81(uVar48 >> 7,0);
        local_5a40._28_4_ = (uint)bVar47 * auVar52._28_4_ | (uint)!bVar47 * -0x800000;
        bVar41 = ~bVar41;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar42 = 7;
        }
        else {
          uVar42 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5d38 = ray + 0x100;
        puVar46 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar38 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5a60;
        uStack_465c = uStack_5a5c;
        uStack_4658 = uStack_5a58;
        uStack_4654 = uStack_5a54;
        uStack_4650 = uStack_5a50;
        uStack_464c = uStack_5a4c;
        uStack_4648 = uStack_5a48;
        uStack_4644 = uStack_5a44;
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar87 = ZEXT3264(auVar52);
        auVar49 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar88 = ZEXT1664(auVar49);
        local_5d50 = context;
        local_5d28 = This;
LAB_01f571e5:
        do {
          do {
            root.ptr = puVar46[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01f57adb;
            puVar46 = puVar46 + -1;
            pauVar38 = pauVar38 + -1;
            auVar52 = *pauVar38;
            auVar62 = ZEXT3264(auVar52);
            uVar48 = vcmpps_avx512vl(auVar52,local_5a40,1);
          } while ((char)uVar48 == '\0');
          uVar43 = (undefined4)uVar48;
          if (uVar42 < (uint)POPCOUNT(uVar43)) {
LAB_01f57227:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01f57adb;
                uVar17 = vcmpps_avx512vl(auVar62._0_32_,local_5a40,9);
                if ((char)uVar17 == '\0') goto LAB_01f571e5;
                local_5d20 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar35 = bVar41;
                if (local_5d20 == 0) goto LAB_01f579c6;
                bVar35 = ~bVar41;
                lVar40 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                uVar48 = 0;
                goto LAB_01f573ee;
              }
              uVar48 = 8;
              lVar40 = 0;
              auVar52 = auVar86._0_32_;
              do {
                uVar44 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar40 * 8);
                if (uVar44 == 8) {
                  auVar62 = ZEXT3264(auVar52);
                  break;
                }
                auVar32._4_4_ = fStack_5b1c;
                auVar32._0_4_ = local_5b20;
                auVar32._8_4_ = fStack_5b18;
                auVar32._12_4_ = fStack_5b14;
                auVar32._16_4_ = fStack_5b10;
                auVar32._20_4_ = fStack_5b0c;
                auVar32._24_4_ = fStack_5b08;
                auVar32._28_4_ = uStack_5b04;
                uVar43 = *(undefined4 *)(root.ptr + 0x40 + lVar40 * 4);
                auVar68._4_4_ = uVar43;
                auVar68._0_4_ = uVar43;
                auVar68._8_4_ = uVar43;
                auVar68._12_4_ = uVar43;
                auVar68._16_4_ = uVar43;
                auVar68._20_4_ = uVar43;
                auVar68._24_4_ = uVar43;
                auVar68._28_4_ = uVar43;
                auVar49 = vfmsub132ps_fma(auVar68,auVar32,local_5b80);
                auVar33._4_4_ = fStack_5afc;
                auVar33._0_4_ = local_5b00;
                auVar33._8_4_ = fStack_5af8;
                auVar33._12_4_ = fStack_5af4;
                auVar33._16_4_ = fStack_5af0;
                auVar33._20_4_ = fStack_5aec;
                auVar33._24_4_ = fStack_5ae8;
                auVar33._28_4_ = uStack_5ae4;
                uVar43 = *(undefined4 *)(root.ptr + 0x80 + lVar40 * 4);
                auVar72._4_4_ = uVar43;
                auVar72._0_4_ = uVar43;
                auVar72._8_4_ = uVar43;
                auVar72._12_4_ = uVar43;
                auVar72._16_4_ = uVar43;
                auVar72._20_4_ = uVar43;
                auVar72._24_4_ = uVar43;
                auVar72._28_4_ = uVar43;
                uVar43 = *(undefined4 *)(root.ptr + 0xc0 + lVar40 * 4);
                auVar74._4_4_ = uVar43;
                auVar74._0_4_ = uVar43;
                auVar74._8_4_ = uVar43;
                auVar74._12_4_ = uVar43;
                auVar74._16_4_ = uVar43;
                auVar74._20_4_ = uVar43;
                auVar74._24_4_ = uVar43;
                auVar74._28_4_ = uVar43;
                auVar21 = vfmsub132ps_fma(auVar72,auVar33,local_5b60);
                auVar22 = vfmsub132ps_fma(auVar74,local_5ae0,local_5b40);
                uVar43 = *(undefined4 *)(root.ptr + 0x60 + lVar40 * 4);
                auVar24._4_4_ = uVar43;
                auVar24._0_4_ = uVar43;
                auVar24._8_4_ = uVar43;
                auVar24._12_4_ = uVar43;
                auVar24._16_4_ = uVar43;
                auVar24._20_4_ = uVar43;
                auVar24._24_4_ = uVar43;
                auVar24._28_4_ = uVar43;
                auVar50 = vfmsub132ps_avx512vl(local_5b80,auVar32,auVar24);
                uVar43 = *(undefined4 *)(root.ptr + 0xa0 + lVar40 * 4);
                auVar25._4_4_ = uVar43;
                auVar25._0_4_ = uVar43;
                auVar25._8_4_ = uVar43;
                auVar25._12_4_ = uVar43;
                auVar25._16_4_ = uVar43;
                auVar25._20_4_ = uVar43;
                auVar25._24_4_ = uVar43;
                auVar25._28_4_ = uVar43;
                auVar53 = vfmsub132ps_avx512vl(local_5b60,auVar33,auVar25);
                uVar43 = *(undefined4 *)(root.ptr + 0xe0 + lVar40 * 4);
                auVar26._4_4_ = uVar43;
                auVar26._0_4_ = uVar43;
                auVar26._8_4_ = uVar43;
                auVar26._12_4_ = uVar43;
                auVar26._16_4_ = uVar43;
                auVar26._20_4_ = uVar43;
                auVar26._24_4_ = uVar43;
                auVar26._28_4_ = uVar43;
                auVar54 = vfmsub132ps_avx512vl(local_5b40,local_5ae0,auVar26);
                auVar51 = vpminsd_avx2(ZEXT1632(auVar49),auVar50);
                auVar55 = vpminsd_avx2(ZEXT1632(auVar21),auVar53);
                auVar51 = vpmaxsd_avx2(auVar51,auVar55);
                auVar55 = vpminsd_avx2(ZEXT1632(auVar22),auVar54);
                auVar51 = vpmaxsd_avx2(auVar51,auVar55);
                auVar55 = vpmaxsd_avx2(ZEXT1632(auVar49),auVar50);
                auVar50 = vpmaxsd_avx2(ZEXT1632(auVar21),auVar53);
                auVar50 = vpminsd_avx2(auVar55,auVar50);
                auVar55 = vpmaxsd_avx2(ZEXT1632(auVar22),auVar54);
                auVar50 = vpminsd_avx2(auVar50,auVar55);
                auVar34._4_4_ = uStack_5a5c;
                auVar34._0_4_ = local_5a60;
                auVar34._8_4_ = uStack_5a58;
                auVar34._12_4_ = uStack_5a54;
                auVar34._16_4_ = uStack_5a50;
                auVar34._20_4_ = uStack_5a4c;
                auVar34._24_4_ = uStack_5a48;
                auVar34._28_4_ = uStack_5a44;
                auVar55 = vpmaxsd_avx2(auVar51,auVar34);
                auVar50 = vpminsd_avx2(auVar50,local_5a40);
                uVar39 = vpcmpd_avx512vl(auVar55,auVar50,2);
                if ((byte)uVar39 == 0) {
                  auVar62 = ZEXT3264(auVar52);
                  uVar44 = uVar48;
                }
                else {
                  auVar55 = vblendmps_avx512vl(auVar86._0_32_,auVar51);
                  bVar47 = (bool)((byte)uVar39 & 1);
                  bVar7 = (bool)((byte)(uVar39 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
                  bVar9 = (bool)((byte)(uVar39 >> 3) & 1);
                  bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
                  bVar11 = (bool)((byte)(uVar39 >> 5) & 1);
                  bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
                  bVar13 = SUB81(uVar39 >> 7,0);
                  auVar62 = ZEXT3264(CONCAT428((uint)bVar13 * auVar55._28_4_ |
                                               (uint)!bVar13 * auVar51._28_4_,
                                               CONCAT424((uint)bVar12 * auVar55._24_4_ |
                                                         (uint)!bVar12 * auVar51._24_4_,
                                                         CONCAT420((uint)bVar11 * auVar55._20_4_ |
                                                                   (uint)!bVar11 * auVar51._20_4_,
                                                                   CONCAT416((uint)bVar10 *
                                                                             auVar55._16_4_ |
                                                                             (uint)!bVar10 *
                                                                             auVar51._16_4_,
                                                                             CONCAT412((uint)bVar9 *
                                                                                       auVar55.
                                                  _12_4_ | (uint)!bVar9 * auVar51._12_4_,
                                                  CONCAT48((uint)bVar8 * auVar55._8_4_ |
                                                           (uint)!bVar8 * auVar51._8_4_,
                                                           CONCAT44((uint)bVar7 * auVar55._4_4_ |
                                                                    (uint)!bVar7 * auVar51._4_4_,
                                                                    (uint)bVar47 * auVar55._0_4_ |
                                                                    (uint)!bVar47 * auVar51._0_4_)))
                                                  )))));
                  if (uVar48 != 8) {
                    *puVar46 = uVar48;
                    puVar46 = puVar46 + 1;
                    *pauVar38 = auVar52;
                    pauVar38 = pauVar38 + 1;
                  }
                }
                uVar48 = uVar44;
                lVar40 = lVar40 + 1;
                auVar52 = auVar62._0_32_;
              } while (lVar40 != 8);
              iVar37 = 4;
              if (uVar48 == 8) goto LAB_01f57396;
              uVar17 = vcmpps_avx512vl(auVar62._0_32_,local_5a40,9);
              root.ptr = uVar48;
            } while ((byte)uVar42 < (byte)POPCOUNT((int)uVar17));
            *puVar46 = uVar48;
            puVar46 = puVar46 + 1;
            *pauVar38 = auVar62._0_32_;
            pauVar38 = pauVar38 + 1;
          }
          else {
            do {
              local_5d00 = auVar52;
              local_5d48 = 0;
              for (uVar44 = uVar48; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                local_5d48 = local_5d48 + 1;
              }
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar47 = occluded1(local_5d28,local_5d30,root,local_5d48,&local_5d51,ray,
                                 (TravRayK<8,_false> *)&local_5c40.field_0,context);
              bVar35 = (byte)(1 << ((uint)local_5d48 & 0x1f));
              if (!bVar47) {
                bVar35 = 0;
              }
              bVar41 = bVar41 | bVar35;
              uVar48 = uVar48 - 1 & uVar48;
              context = local_5d50;
              auVar52 = local_5d00;
            } while (uVar48 != 0);
            if (bVar41 == 0xff) {
              iVar37 = 3;
            }
            else {
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5a40._0_4_ =
                   (uint)(bVar41 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar41 & 1) * local_5a40._0_4_
              ;
              bVar47 = (bool)(bVar41 >> 1 & 1);
              local_5a40._4_4_ = (uint)bVar47 * auVar52._4_4_ | (uint)!bVar47 * local_5a40._4_4_;
              bVar47 = (bool)(bVar41 >> 2 & 1);
              local_5a40._8_4_ = (uint)bVar47 * auVar52._8_4_ | (uint)!bVar47 * local_5a40._8_4_;
              bVar47 = (bool)(bVar41 >> 3 & 1);
              local_5a40._12_4_ = (uint)bVar47 * auVar52._12_4_ | (uint)!bVar47 * local_5a40._12_4_;
              bVar47 = (bool)(bVar41 >> 4 & 1);
              local_5a40._16_4_ = (uint)bVar47 * auVar52._16_4_ | (uint)!bVar47 * local_5a40._16_4_;
              bVar47 = (bool)(bVar41 >> 5 & 1);
              local_5a40._20_4_ = (uint)bVar47 * auVar52._20_4_ | (uint)!bVar47 * local_5a40._20_4_;
              bVar47 = (bool)(bVar41 >> 6 & 1);
              local_5a40._24_4_ = (uint)bVar47 * auVar52._24_4_ | (uint)!bVar47 * local_5a40._24_4_;
              local_5a40._28_4_ =
                   (uint)(bVar41 >> 7) * auVar52._28_4_ |
                   (uint)!(bool)(bVar41 >> 7) * local_5a40._28_4_;
              iVar37 = 2;
            }
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar86 = ZEXT3264(auVar52);
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar87 = ZEXT3264(auVar52);
            auVar49 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
            auVar88 = ZEXT1664(auVar49);
            auVar62 = ZEXT3264(local_5d00);
            if (uVar42 < (uint)POPCOUNT(uVar43)) goto LAB_01f57227;
          }
LAB_01f57396:
        } while ((iVar37 == 4) || (iVar37 == 2));
LAB_01f57adb:
        bVar41 = bVar41 & (byte)local_5d3c;
        bVar47 = (bool)(bVar41 >> 1 & 1);
        bVar7 = (bool)(bVar41 >> 2 & 1);
        bVar8 = (bool)(bVar41 >> 3 & 1);
        bVar9 = (bool)(bVar41 >> 4 & 1);
        bVar10 = (bool)(bVar41 >> 5 & 1);
        bVar11 = (bool)(bVar41 >> 6 & 1);
        *(uint *)local_5d38 =
             (uint)(bVar41 & 1) * -0x800000 | (uint)!(bool)(bVar41 & 1) * *(int *)local_5d38;
        *(uint *)(local_5d38 + 4) =
             (uint)bVar47 * -0x800000 | (uint)!bVar47 * *(int *)(local_5d38 + 4);
        *(uint *)(local_5d38 + 8) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5d38 + 8);
        *(uint *)(local_5d38 + 0xc) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5d38 + 0xc);
        *(uint *)(local_5d38 + 0x10) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5d38 + 0x10);
        *(uint *)(local_5d38 + 0x14) =
             (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_5d38 + 0x14);
        *(uint *)(local_5d38 + 0x18) =
             (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_5d38 + 0x18);
        *(uint *)(local_5d38 + 0x1c) =
             (uint)(bVar41 >> 7) * -0x800000 |
             (uint)!(bool)(bVar41 >> 7) * *(int *)(local_5d38 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar48 = local_5d18 + 1;
    lVar40 = lVar40 + 0x50;
    if (local_5d20 <= uVar48) break;
LAB_01f573ee:
    local_5d08 = uVar48 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_5d10 = context->scene;
    local_5d00._0_8_ = lVar40;
    uVar44 = 0;
    bVar45 = bVar35;
    local_5d18 = uVar48;
    while (*(int *)(lVar40 + uVar44 * 4) != -1) {
      pfVar4 = (local_5d10->vertices).items[*(uint *)(lVar40 + -0x10 + uVar44 * 4)];
      uVar48 = (ulong)*(uint *)(lVar40 + -0x40 + uVar44 * 4);
      fVar1 = pfVar4[uVar48];
      auVar64._4_4_ = fVar1;
      auVar64._0_4_ = fVar1;
      auVar64._8_4_ = fVar1;
      auVar64._12_4_ = fVar1;
      auVar64._16_4_ = fVar1;
      auVar64._20_4_ = fVar1;
      auVar64._24_4_ = fVar1;
      auVar64._28_4_ = fVar1;
      uVar39 = (ulong)*(uint *)(lVar40 + -0x30 + uVar44 * 4);
      fVar2 = pfVar4[uVar48 + 1];
      auVar69._4_4_ = fVar2;
      auVar69._0_4_ = fVar2;
      auVar69._8_4_ = fVar2;
      auVar69._12_4_ = fVar2;
      auVar69._16_4_ = fVar2;
      auVar69._20_4_ = fVar2;
      auVar69._24_4_ = fVar2;
      auVar69._28_4_ = fVar2;
      fVar3 = pfVar4[uVar48 + 2];
      auVar71._4_4_ = fVar3;
      auVar71._0_4_ = fVar3;
      auVar71._8_4_ = fVar3;
      auVar71._12_4_ = fVar3;
      auVar71._16_4_ = fVar3;
      auVar71._20_4_ = fVar3;
      auVar71._24_4_ = fVar3;
      auVar71._28_4_ = fVar3;
      uVar48 = (ulong)*(uint *)(lVar40 + -0x20 + uVar44 * 4);
      fVar14 = fVar1 - pfVar4[uVar39];
      fVar15 = fVar2 - pfVar4[uVar39 + 1];
      fVar16 = fVar3 - pfVar4[uVar39 + 2];
      local_5c70 = *(undefined8 *)(local_5d08 + 0x30);
      uStack_5c68 = *(undefined8 *)(local_5d08 + 0x38);
      local_5c80 = *(undefined8 *)(local_5d08 + 0x40);
      uStack_5c78 = *(undefined8 *)(local_5d08 + 0x48);
      auVar66._4_4_ = fVar14;
      auVar66._0_4_ = fVar14;
      auVar66._8_4_ = fVar14;
      auVar66._12_4_ = fVar14;
      auVar66._16_4_ = fVar14;
      auVar66._20_4_ = fVar14;
      auVar66._24_4_ = fVar14;
      auVar66._28_4_ = fVar14;
      auVar73._4_4_ = fVar15;
      auVar73._0_4_ = fVar15;
      auVar73._8_4_ = fVar15;
      auVar73._12_4_ = fVar15;
      auVar73._16_4_ = fVar15;
      auVar73._20_4_ = fVar15;
      auVar73._24_4_ = fVar15;
      auVar73._28_4_ = fVar15;
      auVar75._4_4_ = fVar16;
      auVar75._0_4_ = fVar16;
      auVar75._8_4_ = fVar16;
      auVar75._12_4_ = fVar16;
      auVar75._16_4_ = fVar16;
      auVar75._20_4_ = fVar16;
      auVar75._24_4_ = fVar16;
      auVar75._28_4_ = fVar16;
      fVar1 = pfVar4[uVar48] - fVar1;
      auVar85._4_4_ = fVar1;
      auVar85._0_4_ = fVar1;
      auVar85._8_4_ = fVar1;
      auVar85._12_4_ = fVar1;
      auVar85._16_4_ = fVar1;
      auVar85._20_4_ = fVar1;
      auVar85._24_4_ = fVar1;
      auVar85._28_4_ = fVar1;
      auVar56 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar4[uVar48 + 1] - fVar2)));
      auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar4[uVar48 + 2] - fVar3)));
      fVar15 = fVar15 * (pfVar4[uVar48 + 2] - fVar3);
      auVar58._4_4_ = fVar15;
      auVar58._0_4_ = fVar15;
      auVar58._8_4_ = fVar15;
      auVar58._12_4_ = fVar15;
      auVar58._16_4_ = fVar15;
      auVar58._20_4_ = fVar15;
      auVar58._24_4_ = fVar15;
      auVar58._28_4_ = fVar15;
      auVar58 = vfmsub231ps_avx512vl(auVar58,auVar56,auVar75);
      fVar1 = fVar16 * fVar1;
      auVar59._4_4_ = fVar1;
      auVar59._0_4_ = fVar1;
      auVar59._8_4_ = fVar1;
      auVar59._12_4_ = fVar1;
      auVar59._16_4_ = fVar1;
      auVar59._20_4_ = fVar1;
      auVar59._24_4_ = fVar1;
      auVar59._28_4_ = fVar1;
      auVar59 = vfmsub231ps_avx512vl(auVar59,auVar57,auVar66);
      fVar14 = fVar14 * (pfVar4[uVar48 + 1] - fVar2);
      auVar63._4_4_ = fVar14;
      auVar63._0_4_ = fVar14;
      auVar63._8_4_ = fVar14;
      auVar63._12_4_ = fVar14;
      auVar63._16_4_ = fVar14;
      auVar63._20_4_ = fVar14;
      auVar63._24_4_ = fVar14;
      auVar63._28_4_ = fVar14;
      auVar22 = vfmsub231ps_fma(auVar63,auVar85,auVar73);
      auVar50 = vsubps_avx(auVar64,*(undefined1 (*) [32])ray);
      auVar53 = vsubps_avx(auVar69,*(undefined1 (*) [32])(ray + 0x20));
      auVar54 = vsubps_avx(auVar71,*(undefined1 (*) [32])(ray + 0x40));
      auVar52 = *(undefined1 (*) [32])(ray + 0x80);
      auVar51 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar55 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar83._0_4_ = auVar51._0_4_ * auVar54._0_4_;
      auVar83._4_4_ = auVar51._4_4_ * auVar54._4_4_;
      auVar83._8_4_ = auVar51._8_4_ * auVar54._8_4_;
      auVar83._12_4_ = auVar51._12_4_ * auVar54._12_4_;
      auVar83._16_4_ = auVar51._16_4_ * auVar54._16_4_;
      auVar83._20_4_ = auVar51._20_4_ * auVar54._20_4_;
      auVar83._24_4_ = auVar51._24_4_ * auVar54._24_4_;
      auVar83._28_4_ = 0;
      auVar23 = vfmsub231ps_fma(auVar83,auVar53,auVar55);
      auVar84._0_4_ = auVar55._0_4_ * auVar50._0_4_;
      auVar84._4_4_ = auVar55._4_4_ * auVar50._4_4_;
      auVar84._8_4_ = auVar55._8_4_ * auVar50._8_4_;
      auVar84._12_4_ = auVar55._12_4_ * auVar50._12_4_;
      auVar84._16_4_ = auVar55._16_4_ * auVar50._16_4_;
      auVar84._20_4_ = auVar55._20_4_ * auVar50._20_4_;
      auVar84._24_4_ = auVar55._24_4_ * auVar50._24_4_;
      auVar84._28_4_ = 0;
      auVar19 = vfmsub231ps_fma(auVar84,auVar54,auVar52);
      auVar62._0_4_ = auVar52._0_4_ * auVar53._0_4_;
      auVar62._4_4_ = auVar52._4_4_ * auVar53._4_4_;
      auVar62._8_4_ = auVar52._8_4_ * auVar53._8_4_;
      auVar62._12_4_ = auVar52._12_4_ * auVar53._12_4_;
      auVar62._16_4_ = auVar52._16_4_ * auVar53._16_4_;
      auVar62._20_4_ = auVar52._20_4_ * auVar53._20_4_;
      auVar62._28_36_ = in_ZMM14._28_36_;
      auVar62._24_4_ = auVar52._24_4_ * auVar53._24_4_;
      auVar20 = vfmsub231ps_fma(auVar62._0_32_,auVar50,auVar51);
      in_ZMM14 = ZEXT1664(auVar20);
      auVar29._4_4_ = auVar22._4_4_ * auVar55._4_4_;
      auVar29._0_4_ = auVar22._0_4_ * auVar55._0_4_;
      auVar29._8_4_ = auVar22._8_4_ * auVar55._8_4_;
      auVar29._12_4_ = auVar22._12_4_ * auVar55._12_4_;
      auVar29._16_4_ = auVar55._16_4_ * 0.0;
      auVar29._20_4_ = auVar55._20_4_ * 0.0;
      auVar29._24_4_ = auVar55._24_4_ * 0.0;
      auVar29._28_4_ = auVar55._28_4_;
      auVar49 = vfmadd231ps_fma(auVar29,auVar59,auVar51);
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar58,auVar52);
      vandps_avx512vl(ZEXT1632(auVar49),auVar87._0_32_);
      auVar52 = vmulps_avx512vl(auVar57,ZEXT1632(auVar20));
      auVar52 = vfmadd231ps_avx512vl(auVar52,ZEXT1632(auVar19),auVar56);
      auVar21 = vfmadd231ps_fma(auVar52,ZEXT1632(auVar23),auVar85);
      uVar76 = auVar59._0_4_;
      auVar56._0_4_ = uVar76 ^ auVar21._0_4_;
      uVar77 = auVar59._4_4_;
      auVar56._4_4_ = uVar77 ^ auVar21._4_4_;
      uVar78 = auVar59._8_4_;
      auVar56._8_4_ = uVar78 ^ auVar21._8_4_;
      uVar79 = auVar59._12_4_;
      auVar56._12_4_ = uVar79 ^ auVar21._12_4_;
      uVar43 = auVar59._16_4_;
      auVar56._16_4_ = uVar43;
      uVar80 = auVar59._20_4_;
      auVar56._20_4_ = uVar80;
      uVar81 = auVar59._24_4_;
      auVar56._24_4_ = uVar81;
      uVar82 = auVar59._28_4_;
      auVar56._28_4_ = uVar82;
      uVar17 = vcmpps_avx512vl(auVar56,auVar88._0_32_,5);
      bVar36 = (byte)uVar17 & bVar45;
      local_5d48 = CONCAT71(local_5d48._1_7_,bVar45);
      if (bVar36 == 0) {
LAB_01f57582:
        bVar36 = 0;
      }
      else {
        auVar57._4_4_ = fVar16 * auVar20._4_4_;
        auVar57._0_4_ = fVar16 * auVar20._0_4_;
        auVar57._8_4_ = fVar16 * auVar20._8_4_;
        auVar57._12_4_ = fVar16 * auVar20._12_4_;
        auVar57._16_4_ = fVar16 * 0.0;
        auVar57._20_4_ = fVar16 * 0.0;
        auVar57._24_4_ = fVar16 * 0.0;
        auVar57._28_4_ = fVar16;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar73,auVar57);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar66,ZEXT1632(auVar21));
        auVar67._0_4_ = uVar76 ^ auVar21._0_4_;
        auVar67._4_4_ = uVar77 ^ auVar21._4_4_;
        auVar67._8_4_ = uVar78 ^ auVar21._8_4_;
        auVar67._12_4_ = uVar79 ^ auVar21._12_4_;
        auVar67._16_4_ = uVar43;
        auVar67._20_4_ = uVar80;
        auVar67._24_4_ = uVar81;
        auVar67._28_4_ = uVar82;
        uVar17 = vcmpps_avx512vl(auVar67,auVar88._0_32_,5);
        bVar36 = bVar36 & (byte)uVar17;
        if (bVar36 == 0) goto LAB_01f57582;
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar28._16_4_ = 0x7fffffff;
        auVar28._20_4_ = 0x7fffffff;
        auVar28._24_4_ = 0x7fffffff;
        auVar28._28_4_ = 0x7fffffff;
        vandps_avx512vl(ZEXT1632(auVar49),auVar28);
        auVar51 = vsubps_avx(auVar52,auVar56);
        uVar17 = vcmpps_avx512vl(auVar51,auVar67,5);
        bVar36 = bVar36 & (byte)uVar17;
        if (bVar36 == 0) goto LAB_01f57582;
        auVar30._4_4_ = auVar54._4_4_ * auVar22._4_4_;
        auVar30._0_4_ = auVar54._0_4_ * auVar22._0_4_;
        auVar30._8_4_ = auVar54._8_4_ * auVar22._8_4_;
        auVar30._12_4_ = auVar54._12_4_ * auVar22._12_4_;
        auVar30._16_4_ = auVar54._16_4_ * 0.0;
        auVar30._20_4_ = auVar54._20_4_ * 0.0;
        auVar30._24_4_ = auVar54._24_4_ * 0.0;
        auVar30._28_4_ = auVar54._28_4_;
        auVar21 = vfmadd213ps_fma(auVar53,auVar59,auVar30);
        auVar21 = vfmadd213ps_fma(auVar50,auVar58,ZEXT1632(auVar21));
        auVar70._0_4_ = auVar52._0_4_ * *(float *)(ray + 0x60);
        auVar70._4_4_ = auVar52._4_4_ * *(float *)(ray + 100);
        auVar70._8_4_ = auVar52._8_4_ * *(float *)(ray + 0x68);
        auVar70._12_4_ = auVar52._12_4_ * *(float *)(ray + 0x6c);
        auVar70._16_4_ = auVar52._16_4_ * *(float *)(ray + 0x70);
        auVar70._20_4_ = auVar52._20_4_ * *(float *)(ray + 0x74);
        auVar70._24_4_ = auVar52._24_4_ * *(float *)(ray + 0x78);
        auVar70._28_4_ = 0;
        auVar65._0_4_ = uVar76 ^ auVar21._0_4_;
        auVar65._4_4_ = uVar77 ^ auVar21._4_4_;
        auVar65._8_4_ = uVar78 ^ auVar21._8_4_;
        auVar65._12_4_ = uVar79 ^ auVar21._12_4_;
        auVar65._16_4_ = uVar43;
        auVar65._20_4_ = uVar80;
        auVar65._24_4_ = uVar81;
        auVar65._28_4_ = uVar82;
        auVar31._4_4_ = auVar52._4_4_ * *(float *)(ray + 0x104);
        auVar31._0_4_ = auVar52._0_4_ * *(float *)(ray + 0x100);
        auVar31._8_4_ = auVar52._8_4_ * *(float *)(ray + 0x108);
        auVar31._12_4_ = auVar52._12_4_ * *(float *)(ray + 0x10c);
        auVar31._16_4_ = auVar52._16_4_ * *(float *)(ray + 0x110);
        auVar31._20_4_ = auVar52._20_4_ * *(float *)(ray + 0x114);
        auVar31._24_4_ = auVar52._24_4_ * *(float *)(ray + 0x118);
        auVar31._28_4_ = auVar54._28_4_;
        uVar17 = vcmpps_avx512vl(auVar65,auVar31,2);
        uVar18 = vcmpps_avx512vl(auVar70,auVar65,1);
        bVar36 = bVar36 & (byte)uVar17 & (byte)uVar18;
        if (bVar36 == 0) {
LAB_01f5799b:
          bVar36 = 0;
        }
        else {
          uVar17 = vcmpps_avx512vl(ZEXT1632(auVar49),ZEXT832(0) << 0x20,4);
          bVar36 = bVar36 & (byte)uVar17;
          if (bVar36 == 0) goto LAB_01f5799b;
          _local_5960 = auVar56;
          _local_5980 = auVar67;
          local_59a0 = auVar65;
          local_59c0 = auVar52;
          local_59e0 = auVar58;
          local_5a00 = auVar59;
          local_5a20 = ZEXT1632(auVar22);
        }
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar86 = ZEXT3264(auVar52);
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar87 = ZEXT3264(auVar52);
        auVar49 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
        auVar88 = ZEXT1664(auVar49);
        context = local_5d50;
      }
      auVar49 = auVar88._0_16_;
      pGVar5 = (context->scene->geometries).items[*(uint *)((long)&local_5c70 + uVar44 * 4)].ptr;
      uVar76 = pGVar5->mask;
      auVar61._4_4_ = uVar76;
      auVar61._0_4_ = uVar76;
      auVar61._8_4_ = uVar76;
      auVar61._12_4_ = uVar76;
      auVar61._16_4_ = uVar76;
      auVar61._20_4_ = uVar76;
      auVar61._24_4_ = uVar76;
      auVar61._28_4_ = uVar76;
      uVar17 = vptestmd_avx512vl(auVar61,*(undefined1 (*) [32])(ray + 0x120));
      bVar36 = (byte)uVar17 & bVar36;
      if (bVar36 == 0) {
      }
      else {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar52 = vrcp14ps_avx512vl(local_59c0);
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = 0x3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar27._16_4_ = 0x3f800000;
          auVar27._20_4_ = 0x3f800000;
          auVar27._24_4_ = 0x3f800000;
          auVar27._28_4_ = 0x3f800000;
          auVar51 = vfnmadd213ps_avx512vl(auVar52,local_59c0,auVar27);
          auVar21 = vfmadd132ps_fma(auVar51,auVar52,auVar52);
          local_58e0._4_4_ = auVar21._4_4_ * (float)local_5960._4_4_;
          local_58e0._0_4_ = auVar21._0_4_ * (float)local_5960._0_4_;
          local_58e0._8_4_ = auVar21._8_4_ * fStack_5958;
          local_58e0._12_4_ = auVar21._12_4_ * fStack_5954;
          local_58e0._16_4_ = fStack_5950 * 0.0;
          local_58e0._20_4_ = fStack_594c * 0.0;
          local_58e0._24_4_ = fStack_5948 * 0.0;
          local_58e0._28_4_ = auVar52._28_4_;
          local_5880 = vpbroadcastd_avx512vl();
          local_58a0 = vpbroadcastd_avx512vl();
          local_5940 = local_59e0._0_8_;
          uStack_5938 = local_59e0._8_8_;
          uStack_5930 = local_59e0._16_8_;
          uStack_5928 = local_59e0._24_8_;
          local_5920 = local_5a00._0_8_;
          uStack_5918 = local_5a00._8_8_;
          uStack_5910 = local_5a00._16_8_;
          uStack_5908 = local_5a00._24_8_;
          local_5900 = local_5a20;
          local_58c0 = auVar21._0_4_ * (float)local_5980._0_4_;
          fStack_58bc = auVar21._4_4_ * (float)local_5980._4_4_;
          fStack_58b8 = auVar21._8_4_ * fStack_5978;
          fStack_58b4 = auVar21._12_4_ * fStack_5974;
          fStack_58b0 = fStack_5970 * 0.0;
          fStack_58ac = fStack_596c * 0.0;
          fStack_58a8 = fStack_5968 * 0.0;
          uStack_58a4 = local_59c0._28_4_;
          vpcmpeqd_avx2(local_58e0,local_58e0);
          uStack_585c = context->user->instID[0];
          local_5860 = uStack_585c;
          uStack_5858 = uStack_585c;
          uStack_5854 = uStack_585c;
          uStack_5850 = uStack_585c;
          uStack_584c = uStack_585c;
          uStack_5848 = uStack_585c;
          uStack_5844 = uStack_585c;
          uStack_583c = context->user->instPrimID[0];
          local_5840 = uStack_583c;
          uStack_5838 = uStack_583c;
          uStack_5834 = uStack_583c;
          uStack_5830 = uStack_583c;
          uStack_582c = uStack_583c;
          uStack_5828 = uStack_583c;
          uStack_5824 = uStack_583c;
          local_5c60 = *(int *)(ray + 0x100);
          iStack_5c5c = *(int *)(ray + 0x104);
          iStack_5c58 = *(int *)(ray + 0x108);
          iStack_5c54 = *(int *)(ray + 0x10c);
          iStack_5c50 = *(int *)(ray + 0x110);
          iStack_5c4c = *(int *)(ray + 0x114);
          iStack_5c48 = *(int *)(ray + 0x118);
          iStack_5c44 = *(int *)(ray + 0x11c);
          auVar52 = vmulps_avx512vl(ZEXT1632(auVar21),local_59a0);
          bVar47 = (bool)(bVar36 >> 1 & 1);
          bVar7 = (bool)(bVar36 >> 2 & 1);
          bVar8 = (bool)(bVar36 >> 3 & 1);
          bVar9 = (bool)(bVar36 >> 4 & 1);
          bVar10 = (bool)(bVar36 >> 5 & 1);
          bVar11 = (bool)(bVar36 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar36 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar36 & 1) * local_5c60;
          *(uint *)(ray + 0x104) = (uint)bVar47 * auVar52._4_4_ | (uint)!bVar47 * iStack_5c5c;
          *(uint *)(ray + 0x108) = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * iStack_5c58;
          *(uint *)(ray + 0x10c) = (uint)bVar8 * auVar52._12_4_ | (uint)!bVar8 * iStack_5c54;
          *(uint *)(ray + 0x110) = (uint)bVar9 * auVar52._16_4_ | (uint)!bVar9 * iStack_5c50;
          *(uint *)(ray + 0x114) = (uint)bVar10 * auVar52._20_4_ | (uint)!bVar10 * iStack_5c4c;
          *(uint *)(ray + 0x118) = (uint)bVar11 * auVar52._24_4_ | (uint)!bVar11 * iStack_5c48;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar36 >> 7) * auVar52._28_4_ | (uint)!(bool)(bVar36 >> 7) * iStack_5c44;
          local_5ca0 = vpmovm2d_avx512vl((ulong)bVar36);
          local_5cd0.valid = (int *)local_5ca0;
          local_5cd0.geometryUserPtr = pGVar5->userPtr;
          local_5cd0.context = context->user;
          local_5cd0.hit = (RTCHitN *)&local_5940;
          local_5cd0.N = 8;
          local_5cd0.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM14 = ZEXT1664(auVar20);
            (*pGVar5->occlusionFilterN)(&local_5cd0);
            auVar49 = vxorps_avx512vl(auVar49,auVar49);
            auVar88 = ZEXT1664(auVar49);
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar87 = ZEXT3264(auVar52);
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar86 = ZEXT3264(auVar52);
            context = local_5d50;
          }
          auVar49 = auVar88._0_16_;
          if (local_5ca0 == (undefined1  [32])0x0) {
            uVar48 = 0;
          }
          else {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              (*p_Var6)(&local_5cd0);
              auVar49 = vxorps_avx512vl(auVar49,auVar49);
              auVar88 = ZEXT1664(auVar49);
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar87 = ZEXT3264(auVar52);
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar86 = ZEXT3264(auVar52);
              context = local_5d50;
            }
            uVar48 = vptestmd_avx512vl(local_5ca0,local_5ca0);
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar47 = (bool)((byte)uVar48 & 1);
            auVar60._0_4_ =
                 (uint)bVar47 * auVar52._0_4_ | (uint)!bVar47 * *(int *)(local_5cd0.ray + 0x100);
            bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar60._4_4_ =
                 (uint)bVar47 * auVar52._4_4_ | (uint)!bVar47 * *(int *)(local_5cd0.ray + 0x104);
            bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar60._8_4_ =
                 (uint)bVar47 * auVar52._8_4_ | (uint)!bVar47 * *(int *)(local_5cd0.ray + 0x108);
            bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
            auVar60._12_4_ =
                 (uint)bVar47 * auVar52._12_4_ | (uint)!bVar47 * *(int *)(local_5cd0.ray + 0x10c);
            bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
            auVar60._16_4_ =
                 (uint)bVar47 * auVar52._16_4_ | (uint)!bVar47 * *(int *)(local_5cd0.ray + 0x110);
            bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
            auVar60._20_4_ =
                 (uint)bVar47 * auVar52._20_4_ | (uint)!bVar47 * *(int *)(local_5cd0.ray + 0x114);
            bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
            auVar60._24_4_ =
                 (uint)bVar47 * auVar52._24_4_ | (uint)!bVar47 * *(int *)(local_5cd0.ray + 0x118);
            bVar47 = SUB81(uVar48 >> 7,0);
            auVar60._28_4_ =
                 (uint)bVar47 * auVar52._28_4_ | (uint)!bVar47 * *(int *)(local_5cd0.ray + 0x11c);
            *(undefined1 (*) [32])(local_5cd0.ray + 0x100) = auVar60;
          }
          bVar36 = (byte)uVar48;
          bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar48 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar48 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar48 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar48 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar48 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar48 >> 7) & 1);
          *(uint *)local_5d38 =
               (uint)(bVar36 & 1) * *(int *)local_5d38 | (uint)!(bool)(bVar36 & 1) * local_5c60;
          *(uint *)(local_5d38 + 4) =
               (uint)bVar47 * *(int *)(local_5d38 + 4) | (uint)!bVar47 * iStack_5c5c;
          *(uint *)(local_5d38 + 8) =
               (uint)bVar7 * *(int *)(local_5d38 + 8) | (uint)!bVar7 * iStack_5c58;
          *(uint *)(local_5d38 + 0xc) =
               (uint)bVar8 * *(int *)(local_5d38 + 0xc) | (uint)!bVar8 * iStack_5c54;
          *(uint *)(local_5d38 + 0x10) =
               (uint)bVar9 * *(int *)(local_5d38 + 0x10) | (uint)!bVar9 * iStack_5c50;
          *(uint *)(local_5d38 + 0x14) =
               (uint)bVar10 * *(int *)(local_5d38 + 0x14) | (uint)!bVar10 * iStack_5c4c;
          *(uint *)(local_5d38 + 0x18) =
               (uint)bVar11 * *(int *)(local_5d38 + 0x18) | (uint)!bVar11 * iStack_5c48;
          *(uint *)(local_5d38 + 0x1c) =
               (uint)bVar12 * *(int *)(local_5d38 + 0x1c) | (uint)!bVar12 * iStack_5c44;
        }
        bVar45 = (byte)local_5d48 & ~bVar36;
      }
      lVar40 = local_5d00._0_8_;
      if ((bVar45 == 0) || (bVar47 = 2 < uVar44, uVar44 = uVar44 + 1, bVar47)) break;
    }
    bVar35 = bVar35 & bVar45;
    if (bVar35 == 0) break;
  }
  bVar35 = ~bVar35;
LAB_01f579c6:
  bVar41 = bVar41 | bVar35;
  if (bVar41 == 0xff) {
    bVar41 = 0xff;
    goto LAB_01f57adb;
  }
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5a40._0_4_ =
       (uint)(bVar41 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar41 & 1) * local_5a40._0_4_;
  bVar47 = (bool)(bVar41 >> 1 & 1);
  local_5a40._4_4_ = (uint)bVar47 * auVar52._4_4_ | (uint)!bVar47 * local_5a40._4_4_;
  bVar47 = (bool)(bVar41 >> 2 & 1);
  local_5a40._8_4_ = (uint)bVar47 * auVar52._8_4_ | (uint)!bVar47 * local_5a40._8_4_;
  bVar47 = (bool)(bVar41 >> 3 & 1);
  local_5a40._12_4_ = (uint)bVar47 * auVar52._12_4_ | (uint)!bVar47 * local_5a40._12_4_;
  bVar47 = (bool)(bVar41 >> 4 & 1);
  local_5a40._16_4_ = (uint)bVar47 * auVar52._16_4_ | (uint)!bVar47 * local_5a40._16_4_;
  bVar47 = (bool)(bVar41 >> 5 & 1);
  local_5a40._20_4_ = (uint)bVar47 * auVar52._20_4_ | (uint)!bVar47 * local_5a40._20_4_;
  bVar47 = (bool)(bVar41 >> 6 & 1);
  local_5a40._24_4_ = (uint)bVar47 * auVar52._24_4_ | (uint)!bVar47 * local_5a40._24_4_;
  local_5a40._28_4_ =
       (uint)(bVar41 >> 7) * auVar52._28_4_ | (uint)!(bool)(bVar41 >> 7) * local_5a40._28_4_;
  goto LAB_01f571e5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }